

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

LargeRep * __thiscall
google::protobuf::internal::MicroString::AllocateOwnedRep
          (MicroString *this,size_t size,Arena *arena)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  LargeRepKind LVar3;
  void *pvVar4;
  char *pcVar5;
  Nonnull<const_char_*> pcVar6;
  ulong uVar7;
  LargeRep *this_00;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  
  if (size < 3) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                       (size,3,"capacity >= kOwned");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 == (Nonnull<const_char_*>)0x0) {
    uVar7 = size + 0x17 & 0xfffffffffffffff8;
    if (arena == (Arena *)0x0) {
      if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
        pvVar4 = operator_new(uVar7);
        auVar8._8_8_ = uVar7;
        auVar8._0_8_ = pvVar4;
        auVar2 = auVar8._0_12_;
      }
      else {
        auVar8 = (**(code **)(in_FS_OFFSET + -0x48))(uVar7,*(undefined8 *)(in_FS_OFFSET + -0x40));
        auVar2 = auVar8._0_12_;
      }
    }
    else {
      pvVar4 = Arena::Allocate(arena,size + 0x17 & 0xfffffffffffffff8);
      auVar1._8_8_ = uVar7;
      auVar1._0_8_ = pvVar4;
      auVar2 = auVar1._0_12_;
    }
    this_00 = auVar2._0_8_;
    this->rep_ = (void *)((ulong)this_00 | 1);
    this_00->capacity = auVar2._8_4_ - 0x10;
    pcVar5 = LargeRep::owned_head(this_00);
    this_00->payload = pcVar5;
    LargeRep::owned_head(this_00);
    this_00->size = (uint32_t)size;
    LVar3 = large_rep_kind(this);
    if (LVar3 == kOwned) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)(int)LVar3,3,"+large_rep_kind() == +kOwned");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      return this_00;
    }
  }
  else {
    AllocateOwnedRep();
  }
  AllocateOwnedRep();
}

Assistant:

MicroString::LargeRep* MicroString::AllocateOwnedRep(size_t size,
                                                     Arena* arena) {
  size_t capacity = size;
  LargeRep* h;
  ABSL_DCHECK_GE(capacity, kOwned);
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(OwnedRepSize(capacity)));
    capacity = alloc.n - sizeof(LargeRep);
    h = reinterpret_cast<LargeRep*>(alloc.p);
  } else {
    size_t alloc_size = ArenaAlignDefault::Ceil(OwnedRepSize(capacity));
    capacity = alloc_size - sizeof(LargeRep);
    auto* alloc = arena->AllocateAligned(alloc_size);
    h = reinterpret_cast<LargeRep*>(alloc);
  }

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  h->capacity = capacity;
  h->payload = h->owned_head();
  h->SetInitialSize(size);

  ABSL_DCHECK_EQ(+large_rep_kind(), +kOwned);

  return h;
}